

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_add(SessionHandle *data,CookieInfo *c,_Bool httpheader,char *lineptr,
                        char *domain,char *path)

{
  char cVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  time_t tVar6;
  Cookie *co;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  time_t tVar14;
  Cookie *pCVar15;
  Cookie *pCVar16;
  Cookie *pCVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  char *local_460;
  in_addr addr;
  char name [1024];
  
  bVar22 = 0;
  tVar6 = time((time_t *)0x0);
  co = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    pcVar7 = (char *)(*Curl_cmalloc)(5000);
    if (pcVar7 == (char *)0x0) {
LAB_004b34b8:
      (*Curl_cfree)(co);
      return (Cookie *)0x0;
    }
    pcVar8 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    bVar21 = false;
    local_460 = domain;
    do {
      *pcVar7 = '\0';
      name._0_8_ = name._0_8_ & 0xffffffffffffff00;
      iVar4 = __isoc99_sscanf(lineptr,"%1023[^;\r\n =]=%4999[^;\r\n]",name,pcVar7);
      if (0 < iVar4) {
        sVar9 = strlen(pcVar7);
        sVar10 = strlen(name);
        for (pcVar11 = lineptr + sVar10; (cVar1 = *pcVar11, cVar1 == ' ' || (cVar1 == '\t'));
            pcVar11 = pcVar11 + 1) {
        }
        for (; (pcVar11 = pcVar7, sVar9 != 0 &&
               ((pcVar7[sVar9 - 1] == ' ' || (pcVar7[sVar9 - 1] == '\t')))); sVar9 = sVar9 - 1) {
          pcVar7[sVar9 - 1] = '\0';
        }
        for (; (*pcVar11 == ' ' || (*pcVar11 == '\t')); pcVar11 = pcVar11 + 1) {
        }
        if (sVar9 != 0) {
LAB_004b35b9:
          iVar4 = Curl_raw_equal("path",name);
          if (iVar4 == 0) {
            iVar4 = Curl_raw_equal("domain",name);
            if (iVar4 == 0) {
              iVar4 = Curl_raw_equal("version",name);
              if (iVar4 == 0) {
                iVar4 = Curl_raw_equal("max-age",name);
                if (iVar4 == 0) {
                  iVar4 = Curl_raw_equal("expires",name);
                  if (iVar4 == 0) {
                    if (co->name == (char *)0x0) {
                      pcVar12 = (*Curl_cstrdup)(name);
                      co->name = pcVar12;
                      pcVar11 = (*Curl_cstrdup)(pcVar11);
                      co->value = pcVar11;
                      if (pcVar11 == (char *)0x0 || co->name == (char *)0x0) goto LAB_004b387c;
                    }
                    goto LAB_004b3888;
                  }
                  if (co->expirestr != (char *)0x0) {
                    (*Curl_cfree)(co->expirestr);
                  }
                  pcVar11 = (*Curl_cstrdup)(pcVar11);
                  co->expirestr = pcVar11;
                }
                else {
                  if (co->maxage != (char *)0x0) {
                    (*Curl_cfree)(co->maxage);
                  }
                  pcVar11 = (*Curl_cstrdup)(pcVar11);
                  co->maxage = pcVar11;
                }
              }
              else {
                if (co->version != (char *)0x0) {
                  (*Curl_cfree)(co->version);
                }
                pcVar11 = (*Curl_cstrdup)(pcVar11);
                co->version = pcVar11;
              }
              if (pcVar11 != (char *)0x0) goto LAB_004b3888;
              bVar19 = true;
              bVar2 = true;
            }
            else {
              pcVar11 = pcVar11 + (*pcVar11 == '.');
              pcVar12 = local_460;
              if (local_460 == (char *)0x0) {
                pcVar12 = pcVar11;
              }
              iVar4 = inet_pton(2,pcVar12,&addr);
              pcVar12 = strchr(pcVar11,0x2e);
              if (pcVar12 == (char *)0x0) {
                local_460 = ":";
              }
              if (local_460 == (char *)0x0) {
LAB_004b3727:
                if (co->domain != (char *)0x0) {
                  (*Curl_cfree)(co->domain);
                }
                pcVar11 = (*Curl_cstrdup)(pcVar11);
                bVar19 = pcVar11 == (char *)0x0;
                co->domain = pcVar11;
                bVar20 = pcVar11 != (char *)0x0;
                if (bVar20) {
                  if (iVar4 == 0) {
                    co->tailmatch = true;
                    bVar19 = false;
                    bVar20 = true;
                  }
                }
                else {
                  bVar21 = true;
                }
              }
              else {
                if (iVar4 == 0) {
                  _Var3 = tailmatch(pcVar11,local_460);
                  if (_Var3) goto LAB_004b3727;
                }
                else {
                  iVar5 = strcmp(pcVar11,local_460);
                  if (iVar5 == 0) goto LAB_004b3727;
                }
                bVar19 = false;
                Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar11);
                bVar21 = true;
                bVar20 = true;
              }
              bVar2 = bVar21;
              if (bVar20) goto LAB_004b3888;
            }
          }
          else {
            if (co->path != (char *)0x0) {
              (*Curl_cfree)(co->path);
            }
            pcVar11 = (*Curl_cstrdup)(pcVar11);
            co->path = pcVar11;
            bVar19 = true;
            if (pcVar11 == (char *)0x0) {
LAB_004b387c:
              bVar19 = true;
              bVar2 = true;
            }
            else {
              pcVar11 = sanitize_cookie_path(pcVar11);
              co->spath = pcVar11;
              bVar2 = true;
              if (pcVar11 != (char *)0x0) goto LAB_004b3888;
            }
          }
        }
        else {
          iVar4 = Curl_raw_equal("secure",name);
          if (iVar4 == 0) {
            iVar4 = Curl_raw_equal("httponly",name);
            if (iVar4 == 0) {
              if (cVar1 == '=') goto LAB_004b35b9;
            }
            else {
              co->httponly = true;
            }
          }
          else {
            co->secure = true;
          }
LAB_004b3888:
          bVar19 = false;
          bVar2 = bVar21;
        }
        bVar21 = bVar2;
        if (bVar19) break;
      }
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
LAB_004b389d:
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          do {
            lineptr = pcVar8 + 1;
            cVar1 = *lineptr;
            pcVar8 = lineptr;
          } while (cVar1 == ' ');
        } while (cVar1 == '\t');
        pcVar8 = strchr(lineptr,0x3b);
        if (pcVar8 == (char *)0x0) {
          if (cVar1 == '\0') goto LAB_004b389d;
          sVar9 = strlen(lineptr);
          pcVar8 = lineptr + sVar9;
        }
      }
    } while (pcVar8 != (char *)0x0);
    pcVar8 = co->maxage;
    if (pcVar8 == (char *)0x0) {
      if (co->expirestr != (char *)0x0) {
        tVar14 = curl_getdate(co->expirestr,(time_t *)0x0);
        co->expires = tVar14;
        if (tVar14 == 0) {
          co->expires = 1;
        }
        else if (tVar14 < 0) {
          co->expires = 0;
        }
      }
    }
    else {
      lVar13 = strtol(pcVar8 + (*pcVar8 == '\"'),(char **)0x0,10);
      co->expires = lVar13;
      if (0x7fffffffffffffff - tVar6 < lVar13) {
        co->expires = 0x7fffffffffffffff;
      }
      else {
        co->expires = lVar13 + tVar6;
      }
    }
    if (((!bVar21) && (co->domain == (char *)0x0)) && (local_460 != (char *)0x0)) {
      pcVar8 = (*Curl_cstrdup)(local_460);
      co->domain = pcVar8;
      bVar21 = true;
      if (pcVar8 != (char *)0x0) {
        bVar21 = false;
      }
    }
    bVar19 = bVar21;
    if (((!bVar21) && (path != (char *)0x0)) && (co->path == (char *)0x0)) {
      pcVar8 = strchr(path,0x3f);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = strrchr(path,0x2f);
      }
      else {
        pcVar8 = (char *)Curl_memrchr(path,0x2f,(long)pcVar8 - (long)path);
      }
      if (pcVar8 != (char *)0x0) {
        pcVar11 = (char *)(*Curl_cmalloc)((size_t)(pcVar8 + (2 - (long)path)));
        co->path = pcVar11;
        if (pcVar11 == (char *)0x0) {
          bVar19 = true;
        }
        else {
          memcpy(pcVar11,path,(size_t)(pcVar8 + (1 - (long)path)));
          co->path[(long)(pcVar8 + (1 - (long)path))] = '\0';
          pcVar8 = sanitize_cookie_path(co->path);
          co->spath = pcVar8;
          bVar19 = true;
          if (pcVar8 != (char *)0x0) {
            bVar19 = bVar21;
          }
        }
      }
    }
    (*Curl_cfree)(pcVar7);
    if ((bVar19) || (co->name == (char *)0x0)) goto LAB_004b3e15;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar4 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar4 == 0) {
      lineptr = lineptr + 10;
      co->httponly = true;
    }
    if (*lineptr == '#') goto LAB_004b34b8;
    pcVar7 = strchr(lineptr,0xd);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    pcVar7 = strchr(lineptr,10);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    pcVar7 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar7 == (char *)0x0) {
      bVar21 = false;
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      bVar21 = false;
      do {
        switch(uVar18) {
        case 0:
          pcVar7 = (*Curl_cstrdup)(pcVar7 + (*pcVar7 == '.'));
          co->domain = pcVar7;
          if (pcVar7 == (char *)0x0) {
            bVar21 = true;
          }
          uVar18 = 0;
          break;
        case 1:
          iVar4 = Curl_raw_equal(pcVar7,"TRUE");
          co->tailmatch = iVar4 != 0;
          uVar18 = 1;
          break;
        case 2:
          iVar4 = strcmp("TRUE",pcVar7);
          if ((iVar4 == 0) || (iVar4 = strcmp("FALSE",pcVar7), iVar4 == 0)) {
            pcVar8 = (*Curl_cstrdup)("/");
            co->path = pcVar8;
            pcVar11 = (*Curl_cstrdup)("/");
            if (pcVar8 == (char *)0x0) {
              bVar21 = true;
            }
            co->spath = pcVar11;
            if (pcVar11 == (char *)0x0) {
              bVar21 = true;
            }
            goto LAB_004b3b91;
          }
          pcVar7 = (*Curl_cstrdup)(pcVar7);
          co->path = pcVar7;
          uVar18 = 2;
          if (pcVar7 == (char *)0x0) {
            bVar21 = true;
          }
          else {
            pcVar7 = sanitize_cookie_path(pcVar7);
            co->spath = pcVar7;
            if (pcVar7 == (char *)0x0) {
              bVar21 = true;
            }
          }
          break;
        case 3:
LAB_004b3b91:
          iVar4 = Curl_raw_equal(pcVar7,"TRUE");
          co->secure = iVar4 != 0;
          uVar18 = 3;
          break;
        case 4:
          lVar13 = strtol(pcVar7,(char **)0x0,10);
          co->expires = lVar13;
          uVar18 = 4;
          break;
        case 5:
          pcVar7 = (*Curl_cstrdup)(pcVar7);
          co->name = pcVar7;
          if (pcVar7 == (char *)0x0) {
            bVar21 = true;
          }
          uVar18 = 5;
          break;
        case 6:
          pcVar7 = (*Curl_cstrdup)(pcVar7);
          co->value = pcVar7;
          if (pcVar7 == (char *)0x0) {
            bVar21 = true;
          }
          uVar18 = 6;
        }
        pcVar7 = strtok_r((char *)0x0,"\t",(char **)name);
        uVar18 = uVar18 + 1;
      } while ((pcVar7 != (char *)0x0) && (!bVar21));
    }
    if (uVar18 == 6) {
      pcVar7 = (*Curl_cstrdup)("");
      co->value = pcVar7;
      bVar19 = true;
      if (pcVar7 != (char *)0x0) {
        bVar19 = bVar21;
      }
      bVar21 = bVar19;
      uVar18 = pcVar7 == (char *)0x0 ^ 7;
    }
    if ((bVar21) || (uVar18 != 7)) goto LAB_004b3e15;
  }
  if ((c->running != false) || ((c->newsession != true || (co->expires != 0)))) {
    co->livecookie = c->running;
    remove_expired(c);
    bVar19 = false;
    bVar21 = false;
    pCVar16 = c->cookies;
    if (c->cookies == (Cookie *)0x0) {
      pCVar17 = (Cookie *)0x0;
    }
    else {
      do {
        pCVar15 = pCVar16;
        iVar4 = Curl_raw_equal(pCVar15->name,co->name);
        if (iVar4 != 0) {
          pcVar7 = pCVar15->domain;
          if (pcVar7 == (char *)0x0) {
LAB_004b3d5b:
            bVar21 = bVar19;
            if (co->domain == (char *)0x0) {
              bVar21 = true;
              bVar19 = true;
            }
          }
          else if (co->domain == (char *)0x0) {
            if (pcVar7 == (char *)0x0) goto LAB_004b3d5b;
          }
          else {
            iVar4 = Curl_raw_equal(pcVar7,co->domain);
            bVar21 = bVar19;
            if (iVar4 != 0) {
              bVar21 = true;
              bVar19 = bVar21;
            }
          }
          if (bVar21) {
            pcVar7 = pCVar15->spath;
            if (pcVar7 == (char *)0x0) {
LAB_004b3d92:
              if (co->spath == (char *)0x0) {
                bVar19 = true;
                bVar21 = true;
              }
              else {
LAB_004b3d99:
                bVar19 = false;
                bVar21 = false;
              }
            }
            else {
              if (co->spath == (char *)0x0) {
                if (pcVar7 == (char *)0x0) goto LAB_004b3d92;
                goto LAB_004b3d99;
              }
              iVar4 = Curl_raw_equal(pcVar7,co->spath);
              bVar21 = iVar4 != 0;
              bVar19 = bVar21;
            }
          }
          if (bVar21) {
            if ((co->livecookie != false) || (pCVar15->livecookie != true)) {
              co->next = pCVar15->next;
              (*Curl_cfree)(pCVar15->name);
              if (pCVar15->value != (char *)0x0) {
                (*Curl_cfree)(pCVar15->value);
              }
              if (pCVar15->domain != (char *)0x0) {
                (*Curl_cfree)(pCVar15->domain);
              }
              if (pCVar15->path != (char *)0x0) {
                (*Curl_cfree)(pCVar15->path);
              }
              if (pCVar15->spath != (char *)0x0) {
                (*Curl_cfree)(pCVar15->spath);
              }
              if (pCVar15->expirestr != (char *)0x0) {
                (*Curl_cfree)(pCVar15->expirestr);
              }
              if (pCVar15->version != (char *)0x0) {
                (*Curl_cfree)(pCVar15->version);
              }
              if (pCVar15->maxage != (char *)0x0) {
                (*Curl_cfree)(pCVar15->maxage);
              }
              pCVar16 = co;
              pCVar17 = pCVar15;
              for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
                pCVar17->next = pCVar16->next;
                pCVar16 = (Cookie *)((long)pCVar16 + (ulong)bVar22 * -0x10 + 8);
                pCVar17 = (Cookie *)((long)pCVar17 + (ulong)bVar22 * -0x10 + 8);
              }
              (*Curl_cfree)(co);
              pCVar16 = pCVar15;
              do {
                pCVar17 = pCVar16;
                pCVar16 = pCVar17->next;
                co = pCVar15;
              } while (pCVar17->next != (Cookie *)0x0);
              break;
            }
            goto LAB_004b3e15;
          }
        }
        pCVar16 = pCVar15->next;
        pCVar17 = pCVar15;
      } while (pCVar15->next != (Cookie *)0x0);
    }
    if (c->running == true) {
      pcVar7 = "Added";
      if (bVar21) {
        pcVar7 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar7,co->name,
                 co->value,co->domain,co->path,co->expires);
    }
    if (!bVar21) {
      if (pCVar17 == (Cookie *)0x0) {
        pCVar17 = (Cookie *)c;
      }
      pCVar17->next = co;
      c->numcookies = c->numcookies + 1;
      return co;
    }
    return co;
  }
LAB_004b3e15:
  freecookie(co);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct SessionHandle *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  char name[MAX_NAME];
  struct Cookie *co;
  struct Cookie *lastc=NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    const char *ptr;
    const char *semiptr;
    char *what;

    what = malloc(MAX_COOKIE_LINE);
    if(!what) {
      free(co);
      return NULL;
    }

    semiptr=strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0]=what[0]=0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n =]=%"
                     MAX_COOKIE_LINE_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len=strlen(what);
        const char *endofn = &ptr[ strlen(name) ];

        /* skip trailing spaces in name */
        while(*endofn && ISBLANK(*endofn))
          endofn++;

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1]=0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr=what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(Curl_raw_equal("secure", name))
            co->secure = TRUE;
          else if(Curl_raw_equal("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(Curl_raw_equal("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(Curl_raw_equal("domain", name)) {
          bool is_ip;
          const char *dotp;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

          is_ip = isip(domain ? domain : whatptr);

          /* check for more dots */
          dotp = strchr(whatptr, '.');
          if(!dotp)
            domain=":";

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch=TRUE; /* we always do that if the domain name was
                                     given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie=TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(Curl_raw_equal("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(Curl_raw_equal("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(Curl_raw_equal("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!co->name) {
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr=semiptr+1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr=strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr=strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      co->expires =
        curlx_strtoofft((*co->maxage=='\"')?
                        &co->maxage[1]:&co->maxage[0], NULL, 10);
      if(CURL_OFF_T_MAX - now < co->expires)
        /* avoid overflow */
        co->expires = CURL_OFF_T_MAX;
      else
        co->expires += now;
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain=strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path+1); /* include ending slash */
        co->path=malloc(pathlen+1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen]=0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    free(what);

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf=NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr=strchr(lineptr, '\r');
    if(ptr)
      *ptr=0; /* clear it */
    ptr=strchr(lineptr, '\n');
    if(ptr)
      *ptr=0; /* clear it */

    firstptr=strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr=firstptr, fields=0; ptr && !badcookie;
        ptr=strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = Curl_raw_equal(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = Curl_raw_equal(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        co->expires = curlx_strtoofft(ptr, NULL, 10);
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(Curl_raw_equal(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(Curl_raw_equal(clist->domain, co->domain))
          /* The domains are identical */
          replace_old=TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(Curl_raw_equal(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        if(clist->value)
          free(clist->value);
        if(clist->domain)
          free(clist->domain);
        if(clist->path)
          free(clist->path);
        if(clist->spath)
          free(clist->spath);
        if(clist->expirestr)
          free(clist->expirestr);

        if(clist->version)
          free(clist->version);
        if(clist->maxage)
          free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}